

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O2

void __thiscall RGBSpectrum_RoundTripsRGB_Test::TestBody(RGBSpectrum_RoundTripsRGB_Test *this)

{
  DenselySampledSpectrum *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Allocator alloc;
  Message *pMVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  Float FVar10;
  Float FVar11;
  undefined1 extraout_var [60];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  XYZ XVar16;
  RGB RVar17;
  Float eps;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  RGB rgb;
  RGB local_d0;
  AssertHelper local_c0;
  SquareMatrix<3> *local_b8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_b0;
  RGBColorSpace *local_a8;
  SpectrumHandle local_a0;
  XYZ local_98;
  DenselySampledSpectrum rsIllum;
  RNG rng;
  RGBReflectanceSpectrum rs;
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  local_b0.bits = (ulong)&rsIllum | 0x2000000000000;
  this_00 = &pbrt::RGBColorSpace::sRGB->illuminant;
  local_a8 = pbrt::RGBColorSpace::sRGB;
  local_b8 = &pbrt::RGBColorSpace::sRGB->RGBFromXYZ;
  for (iVar6 = 0; iVar6 != 100; iVar6 = iVar6 + 1) {
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    fVar9 = pbrt::RNG::Uniform<float>(&rng);
    auVar12._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar12._4_60_ = extraout_var;
    rgb.r = fVar8;
    rgb.g = fVar9;
    rgb.b = auVar12._0_4_;
    pbrt::RGBReflectanceSpectrum::RGBReflectanceSpectrum(&rs,local_a8,&rgb);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::DenselySampledSpectrum::DenselySampledSpectrum(&rsIllum,0x168,0x33e,alloc);
    for (lVar4 = 0; auVar15 = auVar12._8_56_, lVar4 != 0x1d7; lVar4 = lVar4 + 1) {
      fVar8 = (float)((int)lVar4 + 0x168);
      FVar10 = pbrt::RGBReflectanceSpectrum::operator()(&rs,fVar8);
      FVar11 = pbrt::DenselySampledSpectrum::operator()(this_00,fVar8);
      auVar12 = ZEXT464((uint)(FVar11 * FVar10));
      rsIllum.values.ptr[lVar4] = FVar11 * FVar10;
    }
    local_a0.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )local_b0.bits;
    XVar16 = pbrt::SpectrumToXYZ(&local_a0);
    local_98.Z = XVar16.Z;
    auVar13._0_8_ = XVar16._0_8_;
    auVar13._8_56_ = auVar15;
    local_98._0_8_ = vmovlps_avx(auVar13._0_16_);
    RVar17 = pbrt::Mul<pbrt::RGB,3,pbrt::XYZ>(local_b8,&local_98);
    local_d0.b = RVar17.b;
    auVar14._0_8_ = RVar17._0_8_;
    auVar14._8_56_ = auVar15;
    local_d0._0_8_ = vmovlps_avx(auVar14._0_16_);
    eps = 0.01;
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)(rgb.r - RVar17.r)),auVar7);
    local_e8.ptr_._0_4_ = auVar7._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)&gtest_ar,"std::abs(rgb.r - rgb2.r)","eps",(float *)&local_e8,&eps);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e8);
      pMVar3 = testing::Message::operator<<((Message *)&local_e8,&rgb);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [5])" vs ");
      pMVar3 = testing::Message::operator<<(pMVar3,&local_d0);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x75,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    auVar1._8_4_ = 0x7fffffff;
    auVar1._0_8_ = 0x7fffffff7fffffff;
    auVar1._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)(rgb.g - local_d0.g)),auVar1);
    local_e8.ptr_._0_4_ = auVar7._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)&gtest_ar,"std::abs(rgb.g - rgb2.g)","eps",(float *)&local_e8,&eps);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e8);
      pMVar3 = testing::Message::operator<<((Message *)&local_e8,&rgb);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [5])" vs ");
      pMVar3 = testing::Message::operator<<(pMVar3,&local_d0);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x76,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)(rgb.b - local_d0.b)),auVar2);
    local_e8.ptr_._0_4_ = auVar7._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)&gtest_ar,"std::abs(rgb.b - rgb2.b)","eps",(float *)&local_e8,&eps);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e8);
      pMVar3 = testing::Message::operator<<((Message *)&local_e8,&rgb);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [5])" vs ");
      pMVar3 = testing::Message::operator<<(pMVar3,&local_d0);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x77,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_e8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rsIllum.values);
  }
  return;
}

Assistant:

TEST(RGBSpectrum, RoundTripsRGB) {
    RNG rng;
    const RGBColorSpace &cs = *RGBColorSpace::sRGB;

    for (int i = 0; i < 100; ++i) {
        RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
        RGBReflectanceSpectrum rs(cs, rgb);

        DenselySampledSpectrum rsIllum = DenselySampledSpectrum::SampleFunction(
            [&](Float lambda) { return rs(lambda) * cs.illuminant(lambda); });
        XYZ xyz = SpectrumToXYZ(&rsIllum);
        RGB rgb2 = cs.ToRGB(xyz);

        // Some error comes from the fact that piecewise linear (at 5nm)
        // CIE curves were used for the optimization while we use piecewise
        // linear at 1nm spacing converted to 1nm constant / densely
        // sampled.
        Float eps = .01;
        EXPECT_LT(std::abs(rgb.r - rgb2.r), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.g - rgb2.g), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.b - rgb2.b), eps) << rgb << " vs " << rgb2;
    }
}